

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

int __thiscall QFormLayoutItem::vStretch(QFormLayoutItem *this)

{
  QWidget *pQVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int local_24;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = widget((QFormLayoutItem *)0x4b981a);
  if (pQVar1 == (QWidget *)0x0) {
    local_24 = 0;
  }
  else {
    widget((QFormLayoutItem *)0x4b982a);
    local_c.bits = (Bits)QWidget::sizePolicy(in_RDI);
    local_24 = QSizePolicy::verticalStretch((QSizePolicy *)&local_c.bits);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int vStretch() const { return widget() ? widget()->sizePolicy().verticalStretch() : 0; }